

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_test_driver.cc
# Opt level: O1

void __thiscall
libaom_test::DecoderTest::RunLoop
          (DecoderTest *this,CompressedVideoSource *video,aom_codec_dec_cfg_t *dec_cfg)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  Decoder *pDVar4;
  undefined8 *puVar5;
  char cVar6;
  size_type sVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  aom_codec_err_t aVar13;
  uint uVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *__s;
  size_t sVar15;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  aom_image_t *paVar16;
  aom_codec_ctx_t *ctx;
  SEARCH_METHODS *pSVar17;
  char *in_R9;
  bool bVar18;
  Decoder *decoder;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  aom_codec_err_t res_dec;
  aom_codec_stream_info_t stream_info;
  Decoder *local_98;
  AssertHelper local_90;
  undefined8 *local_88;
  uint local_7c;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  string local_70;
  AssertHelper local_50;
  long *local_48 [2];
  uint local_34;
  
  uVar1._0_4_ = dec_cfg->threads;
  uVar1._4_4_ = dec_cfg->w;
  uVar2._0_4_ = dec_cfg->h;
  uVar2._4_4_ = dec_cfg->allow_lowbitdepth;
  iVar10 = (*this->codec_->_vptr_CodecFactory[3])(this->codec_,uVar1,uVar2,this->flags_);
  local_98 = (Decoder *)CONCAT44(extraout_var,iVar10);
  local_48[0] = (long *)0x0;
  testing::internal::CmpHelperNE<libaom_test::Decoder*,decltype(nullptr)>
            ((internal *)&local_70,"decoder","nullptr",&local_98,local_48);
  sVar7 = local_70._M_string_length;
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_48);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pSVar17 = "";
    }
    else {
      pSVar17 = *(SEARCH_METHODS **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/decode_test_driver.cc"
               ,0x3b,(char *)pSVar17);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_48[0] !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*local_48[0] + 8))();
    }
    if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_70._M_string_length !=
          (undefined8 *)(local_70._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_70._M_string_length);
      }
      operator_delete((void *)local_70._M_string_length);
    }
    return;
  }
  if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_70._M_string_length !=
        (undefined8 *)(local_70._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_70._M_string_length);
    }
    operator_delete((void *)sVar7);
  }
  (*video->_vptr_CompressedVideoSource[3])(video);
  bVar18 = false;
  local_7c = 0;
  do {
    bVar9 = true;
    bVar8 = testing::Test::HasFatalFailure();
    if (!bVar8) {
      bVar9 = testing::Test::HasNonfatalFailure();
    }
    if ((bVar9 != false) || (bVar18)) goto LAB_0046821d;
    (*this->_vptr_DecoderTest[4])(this,video,local_98);
    local_34 = 0;
    iVar10 = (*video->_vptr_CompressedVideoSource[5])(video);
    pDVar4 = local_98;
    if (CONCAT44(extraout_var_00,iVar10) == 0) {
      local_50.data_._0_4_ = Decoder::DecodeFrame(local_98,(uint8_t *)0x0,0,(void *)0x0);
      local_90.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                ((internal *)&local_70,"AOM_CODEC_OK","res_dec",(aom_codec_err_t *)&local_90,
                 (aom_codec_err_t *)&local_50);
      cVar6 = (char)local_70._M_dataplus._M_p;
      if ((char)local_70._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_90);
        ctx = &local_98->decoder_;
        __s = aom_codec_error_detail(ctx);
        if (__s == (char *)0x0) {
          __s = aom_codec_error(ctx);
        }
        lVar3 = CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_);
        if (__s == (char *)0x0) {
          sVar15 = 6;
          __s = "(null)";
        }
        else {
          sVar15 = strlen(__s);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar3 + 0x10),__s,sVar15);
        pSVar17 = "";
        if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
          pSVar17 = *(SEARCH_METHODS **)local_70._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/decode_test_driver.cc"
                   ,0x59,(char *)pSVar17);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
        if ((long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 8))();
        }
      }
      sVar7 = local_70._M_string_length;
      if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_70._M_string_length !=
            (undefined8 *)(local_70._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_70._M_string_length);
        }
        operator_delete((void *)sVar7);
      }
      iVar10 = 1;
      if (cVar6 != '\0') {
        bVar18 = true;
        goto LAB_00468190;
      }
    }
    else {
      uVar14 = local_7c;
      if ((local_7c & 1) == 0) {
        iVar10 = (*video->_vptr_CompressedVideoSource[5])(video);
        iVar11 = (*video->_vptr_CompressedVideoSource[6])(video);
        iVar12 = (*pDVar4->_vptr_Decoder[2])(pDVar4);
        aVar13 = aom_codec_peek_stream_info
                           ((aom_codec_iface_t *)CONCAT44(extraout_var_03,iVar12),
                            (uint8_t *)CONCAT44(extraout_var_01,iVar10),
                            CONCAT44(extraout_var_02,iVar11),(aom_codec_stream_info_t *)local_48);
        (*this->_vptr_DecoderTest[7])(this,local_98,video,(ulong)aVar13);
        bVar8 = testing::Test::HasFatalFailure();
        if (bVar8) {
          bVar8 = false;
        }
        else {
          bVar8 = testing::Test::HasNonfatalFailure();
          bVar8 = !bVar8;
        }
        local_90.data_._0_4_ = CONCAT31(local_90.data_._1_3_,bVar8);
        local_88 = (undefined8 *)0x0;
        if (bVar8 == false) {
          testing::Message::Message((Message *)&local_78);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_70,(internal *)&local_90,
                     (AssertionResult *)"::testing::Test::HasFailure()","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/decode_test_driver.cc"
                     ,0x4f,local_70._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if (local_78._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_78._M_head_impl + 8))();
          }
        }
        puVar5 = local_88;
        if (local_88 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_88 != local_88 + 2) {
            operator_delete((undefined8 *)*local_88);
          }
          operator_delete(puVar5);
        }
        local_7c = local_7c & 0xff;
        iVar10 = 1;
        uVar14 = 1;
        if (bVar8 == false) goto LAB_004681e8;
      }
      local_7c = uVar14;
      pDVar4 = local_98;
      iVar10 = (*video->_vptr_CompressedVideoSource[5])(video);
      iVar11 = (*video->_vptr_CompressedVideoSource[6])(video);
      aVar13 = Decoder::DecodeFrame
                         (pDVar4,(uint8_t *)CONCAT44(extraout_var_04,iVar10),
                          CONCAT44(extraout_var_05,iVar11),(void *)0x0);
      iVar10 = (*this->_vptr_DecoderTest[5])(this,(ulong)aVar13,video);
      if ((char)iVar10 == '\0') {
        iVar10 = 2;
      }
      else {
LAB_00468190:
        local_70._M_dataplus._M_p = (pointer)&local_98->decoder_;
        local_70._M_string_length = 0;
        while (((bVar8 = testing::Test::HasFatalFailure(), !bVar8 &&
                (bVar8 = testing::Test::HasNonfatalFailure(), !bVar8)) &&
               (paVar16 = aom_codec_get_frame((aom_codec_ctx_t *)local_70._M_dataplus._M_p,
                                              (aom_codec_iter_t *)&local_70._M_string_length),
               paVar16 != (aom_image_t *)0x0))) {
          uVar14 = (*video->_vptr_CompressedVideoSource[7])(video);
          (*this->_vptr_DecoderTest[6])(this,paVar16,(ulong)uVar14);
        }
        iVar10 = 0;
      }
    }
LAB_004681e8:
    if (iVar10 != 0) {
      if (iVar10 != 2) {
        return;
      }
LAB_0046821d:
      if (local_98 == (Decoder *)0x0) {
        return;
      }
      (*local_98->_vptr_Decoder[1])();
      return;
    }
    (*video->_vptr_CompressedVideoSource[4])(video);
  } while( true );
}

Assistant:

void DecoderTest::RunLoop(CompressedVideoSource *video,
                          const aom_codec_dec_cfg_t &dec_cfg) {
  Decoder *const decoder = codec_->CreateDecoder(dec_cfg, flags_);
  ASSERT_NE(decoder, nullptr);
  bool end_of_file = false;
  bool peeked_stream = false;

  // Decode frames.
  for (video->Begin(); !::testing::Test::HasFailure() && !end_of_file;
       video->Next()) {
    PreDecodeFrameHook(*video, decoder);

    aom_codec_stream_info_t stream_info;
    stream_info.is_annexb = 0;

    if (video->cxdata() != nullptr) {
      if (!peeked_stream) {
        // TODO(yaowu): PeekStream returns error for non-sequence_header_obu,
        // therefore should only be tried once per sequence, this shall be fixed
        // once PeekStream is updated to properly operate on other obus.
        const aom_codec_err_t res_peek = decoder->PeekStream(
            video->cxdata(), video->frame_size(), &stream_info);
        HandlePeekResult(decoder, video, res_peek);
        ASSERT_FALSE(::testing::Test::HasFailure());
        peeked_stream = true;
      }

      aom_codec_err_t res_dec =
          decoder->DecodeFrame(video->cxdata(), video->frame_size());
      if (!HandleDecodeResult(res_dec, *video, decoder)) break;
    } else {
      // Signal end of the file to the decoder.
      const aom_codec_err_t res_dec = decoder->DecodeFrame(nullptr, 0);
      ASSERT_EQ(AOM_CODEC_OK, res_dec) << decoder->DecodeError();
      end_of_file = true;
    }

    DxDataIterator dec_iter = decoder->GetDxData();
    const aom_image_t *img = nullptr;

    // Get decompressed data
    while (!::testing::Test::HasFailure() && (img = dec_iter.Next()))
      DecompressedFrameHook(*img, video->frame_number());
  }
  delete decoder;
}